

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O2

void __thiscall OpenMD::RNEMD::RNEMD::doRNEMD(RNEMD *this)

{
  RealType s;
  double dVar1;
  SelectionManager reducedCommonA;
  SelectionManager tempCommonB;
  SelectionManager tempCommonA;
  SelectionManager reducedTempCommonB;
  SelectionManager reducedTempCommonA;
  SelectionManager reducedCommonB;
  SelectionManager local_4e0;
  SelectionManager local_418;
  SelectionManager local_350;
  SelectionManager local_288;
  SelectionManager local_1c0;
  SelectionManager local_f8;
  
  if (this->doRNEMD_ == true) {
    this->trialCount_ = this->trialCount_ + 1;
    Snapshot::getHmat((Mat3x3d *)&local_4e0,this->currentSnap_);
    RectMatrix<double,_3U,_3U>::operator=
              ((RectMatrix<double,_3U,_3U> *)&this->hmat_,(RectMatrix<double,_3U,_3U> *)&local_4e0);
    SelectionEvaluator::loadScriptString(&this->evaluator_,&this->rnemdObjectSelection_);
    if ((this->evaluator_).isDynamic_ == true) {
      SelectionEvaluator::evaluate((SelectionSet *)&local_4e0,&this->evaluator_);
      SelectionManager::setSelectionSet(&this->seleMan_,(SelectionSet *)&local_4e0);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_4e0);
    }
    SelectionEvaluator::loadScriptString(&this->evaluatorA_,&this->selectionA_);
    if ((this->evaluatorA_).isDynamic_ == true) {
      SelectionEvaluator::evaluate((SelectionSet *)&local_4e0,&this->evaluatorA_);
      SelectionManager::setSelectionSet(&this->seleManA_,(SelectionSet *)&local_4e0);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_4e0);
    }
    SelectionEvaluator::loadScriptString(&this->evaluatorB_,&this->selectionB_);
    if ((this->evaluatorB_).isDynamic_ == true) {
      SelectionEvaluator::evaluate((SelectionSet *)&local_4e0,&this->evaluatorB_);
      SelectionManager::setSelectionSet(&this->seleManB_,(SelectionSet *)&local_4e0);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_4e0);
    }
    operator&(&local_4e0,&this->seleManA_,&this->seleMan_);
    SelectionManager::operator=(&this->commonA_,&local_4e0);
    SelectionManager::~SelectionManager(&local_4e0);
    operator&(&local_4e0,&this->seleManB_,&this->seleMan_);
    SelectionManager::operator=(&this->commonB_,&local_4e0);
    SelectionManager::~SelectionManager(&local_4e0);
    SelectionManager::removeAtomsInRigidBodies(&local_4e0,&this->commonA_);
    SelectionManager::removeAtomsInRigidBodies(&local_f8,&this->commonB_);
    s = getDefaultDividingArea(this);
    this->kineticTarget_ = this->kineticFlux_ * this->exchangeTime_ * s;
    operator*((Vector<double,_3U> *)&local_418,&(this->momentumFluxVector_).super_Vector<double,_3U>
              ,this->exchangeTime_);
    operator*((Vector<double,_3U> *)&local_350,(Vector<double,_3U> *)&local_418,s);
    Vector3<double>::operator=(&this->momentumTarget_,(Vector<double,_3U> *)&local_350);
    operator*((Vector<double,_3U> *)&local_418,
              &(this->angularMomentumFluxVector_).super_Vector<double,_3U>,this->exchangeTime_);
    operator*((Vector<double,_3U> *)&local_350,(Vector<double,_3U> *)&local_418,s);
    Vector3<double>::operator=(&this->angularMomentumTarget_,(Vector<double,_3U> *)&local_350);
    dVar1 = s * this->exchangeTime_ * this->particleFlux_;
    this->particleTarget_ = dVar1;
    if (1.0 < ABS(dVar1)) {
      snprintf(painCave.errMsg,2000,
               "RNEMD: The current particleFlux,\n\t\t%f\n\thas resulted in a target particle exchange of %f.\n\tThis is equivalent to moving more than one particle\n\tduring each exchange.  Please reduce your particleFlux.\n"
              );
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    if (this->rnemdFluxType_ - rnemdParticle < 3) {
      operator&(&local_350,&this->seleManA_,&this->outputSeleMan_);
      operator&(&local_418,&this->seleManB_,&this->outputSeleMan_);
      SelectionManager::removeAtomsInRigidBodies(&local_1c0,&local_350);
      SelectionManager::removeAtomsInRigidBodies(&local_288,&local_418);
      (*this->_vptr_RNEMD[2])(this,&local_1c0,&local_288);
      SelectionManager::~SelectionManager(&local_288);
      SelectionManager::~SelectionManager(&local_1c0);
      SelectionManager::~SelectionManager(&local_418);
      SelectionManager::~SelectionManager(&local_350);
    }
    else {
      (*this->_vptr_RNEMD[2])(this,&local_4e0,&local_f8);
    }
    SelectionManager::~SelectionManager(&local_f8);
    SelectionManager::~SelectionManager(&local_4e0);
  }
  return;
}

Assistant:

void RNEMD::doRNEMD() {
    if (!doRNEMD_) return;
    trialCount_++;
    hmat_ = currentSnap_->getHmat();

    // dynamic object evaluators:
    evaluator_.loadScriptString(rnemdObjectSelection_);
    if (evaluator_.isDynamic()) seleMan_.setSelectionSet(evaluator_.evaluate());

    evaluatorA_.loadScriptString(selectionA_);
    if (evaluatorA_.isDynamic())
      seleManA_.setSelectionSet(evaluatorA_.evaluate());

    evaluatorB_.loadScriptString(selectionB_);
    if (evaluatorB_.isDynamic())
      seleManB_.setSelectionSet(evaluatorB_.evaluate());

    commonA_ = seleManA_ & seleMan_;
    commonB_ = seleManB_ & seleMan_;

    auto reducedCommonA = commonA_.removeAtomsInRigidBodies();
    auto reducedCommonB = commonB_.removeAtomsInRigidBodies();

    // Target exchange quantities (in each exchange) = flux * dividingArea *
    // dt flux = target flux dividingArea = smallest dividing surface between
    // the two regions dt = exchange time interval

    RealType area = getDefaultDividingArea();

    kineticTarget_         = kineticFlux_ * exchangeTime_ * area;
    momentumTarget_        = momentumFluxVector_ * exchangeTime_ * area;
    angularMomentumTarget_ = angularMomentumFluxVector_ * exchangeTime_ * area;
    particleTarget_        = particleFlux_ * exchangeTime_ * area;

    if (std::fabs(particleTarget_) > 1.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current particleFlux,\n"
               "\t\t%f\n"
               "\thas resulted in a target particle exchange of %f.\n"
               "\tThis is equivalent to moving more than one particle\n"
               "\tduring each exchange.  Please reduce your particleFlux.\n",
               particleFlux_, particleTarget_);
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (rnemdFluxType_ == rnemdParticle || rnemdFluxType_ == rnemdParticleKE ||
        rnemdFluxType_ == rnemdCurrentDensity) {
      SelectionManager tempCommonA = seleManA_ & outputSeleMan_;
      SelectionManager tempCommonB = seleManB_ & outputSeleMan_;

      auto reducedTempCommonA = tempCommonA.removeAtomsInRigidBodies();
      auto reducedTempCommonB = tempCommonB.removeAtomsInRigidBodies();

      this->doRNEMDImpl(reducedTempCommonA, reducedTempCommonB);
    } else {
      this->doRNEMDImpl(reducedCommonA, reducedCommonB);
    }
  }